

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall
cmCTestSVN::DoRevisionSVN
          (cmCTestSVN *this,Revision *revision,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  size_t __n;
  SVNInfo *pSVar1;
  int iVar2;
  
  if (((this->RootInfo->Base)._M_string_length == 0) &&
     ((changes->
      super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>)._M_impl
      .super__Vector_impl_data._M_start !=
      (changes->
      super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>)._M_impl
      .super__Vector_impl_data._M_finish)) {
    GuessBase(this,this->RootInfo,changes);
  }
  __n = (revision->super_Revision).Rev._M_string_length;
  pSVar1 = revision->SVNInfo;
  if (__n == (pSVar1->OldRevision)._M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((revision->super_Revision).Rev._M_dataplus._M_p,
                   (pSVar1->OldRevision)._M_dataplus._M_p,__n);
      if (iVar2 != 0) goto LAB_005a3bbf;
    }
    if ((pSVar1->LocalPath)._M_string_length != 0) {
      return;
    }
  }
LAB_005a3bbf:
  cmCTestGlobalVC::DoRevision(&this->super_cmCTestGlobalVC,&revision->super_Revision,changes);
  return;
}

Assistant:

void cmCTestSVN::DoRevisionSVN(Revision const& revision,
                               std::vector<Change> const& changes)
{
  // Guess the base checkout path from the changes if necessary.
  if (this->RootInfo->Base.empty() && !changes.empty()) {
    this->GuessBase(*this->RootInfo, changes);
  }

  // Ignore changes in the old revision for external repositories
  if (revision.Rev == revision.SVNInfo->OldRevision &&
      !revision.SVNInfo->LocalPath.empty()) {
    return;
  }

  this->cmCTestGlobalVC::DoRevision(revision, changes);
}